

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse_test.c
# Opt level: O1

int main(int argc,char **argv)

{
  int *piVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  uint uVar3;
  uint uVar4;
  undefined8 uVar5;
  long lVar6;
  int iVar7;
  bool bVar8;
  REF_GRID_conflict ref_grid_2;
  REF_BOOL allowed_3;
  REF_MPI ref_mpi;
  REF_INT tri1;
  REF_BOOL allowed_1;
  REF_INT tri2;
  REF_GRID_conflict ref_grid;
  REF_GRID_conflict local_d8 [2];
  int local_c4;
  REF_MPI local_c0;
  undefined8 local_b8;
  int local_b0;
  int local_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  
  uVar3 = ref_mpi_start(argc,argv);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
           ,0x35,"main",(ulong)uVar3,"start");
    return uVar3;
  }
  uVar3 = ref_mpi_create(&local_c0);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
           ,0x36,"main",(ulong)uVar3,"create");
    return uVar3;
  }
  if (2 < argc) {
    uVar3 = ref_part_by_extension((REF_GRID_conflict *)&local_a8,local_c0,argv[1]);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x3b,"main",(ulong)uVar3,"examine header");
      return uVar3;
    }
    ref_mpi_stopwatch_stop(local_a8->mpi,"read grid");
    uVar3 = ref_part_metric(local_a8->node,argv[2]);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x3d,"main",(ulong)uVar3,"get metric");
      return uVar3;
    }
    ref_mpi_stopwatch_stop(local_a8->mpi,"read metric");
    if (argc != 3) {
      uVar3 = ref_egads_load(local_a8->geom,argv[3]);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
               ,0x40,"main",(ulong)uVar3,"load egads geom");
        return uVar3;
      }
      ref_mpi_stopwatch_stop(local_a8->mpi,"load geom");
    }
    uVar3 = ref_validation_cell_volume(local_a8);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x44,"main",(ulong)uVar3,"vol");
      return uVar3;
    }
    uVar3 = ref_histogram_quality(local_a8);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x45,"main",(ulong)uVar3,"gram");
      return uVar3;
    }
    uVar3 = ref_histogram_ratio(local_a8);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x46,"main",(ulong)uVar3,"gram");
      return uVar3;
    }
    ref_mpi_stopwatch_stop(local_a8->mpi,"stats");
    iVar7 = 5;
    do {
      uVar3 = ref_collapse_pass(local_a8);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
               ,0x4a,"main",(ulong)uVar3,"col pass");
        return uVar3;
      }
      ref_mpi_stopwatch_stop(local_a8->mpi,"adapt col");
      uVar3 = ref_validation_cell_volume(local_a8);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
               ,0x4d,"main",(ulong)uVar3,"vol");
        return uVar3;
      }
      uVar3 = ref_histogram_quality(local_a8);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
               ,0x4e,"main",(ulong)uVar3,"gram");
        return uVar3;
      }
      uVar3 = ref_histogram_ratio(local_a8);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
               ,0x4f,"main",(ulong)uVar3,"gram");
        return uVar3;
      }
      ref_mpi_stopwatch_stop(local_a8->mpi,"stats");
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
    uVar3 = ref_grid_free(local_a8);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x53,"main",(ulong)uVar3,"free");
      return uVar3;
    }
    uVar3 = ref_mpi_free(local_c0);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x55,"main",(ulong)uVar3,"free");
      return uVar3;
    }
    uVar3 = ref_mpi_stop();
    if (uVar3 == 0) {
      return 0;
    }
    uVar5 = 0x56;
    goto LAB_0010d92d;
  }
  uVar3 = ref_fixture_tet_grid((REF_GRID_conflict *)&local_a8,local_c0);
  if (uVar3 == 0) {
    uVar3 = ref_collapse_edge(local_a8,0,3);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x62,"main",(ulong)uVar3,"collapse");
      goto LAB_0010db08;
    }
    iVar7 = local_a8->cell[8]->n;
    lVar6 = (long)iVar7;
    if (lVar6 != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,100,"main","tet",0,lVar6);
    }
    uVar3 = (uint)(lVar6 != 0);
    if (iVar7 != 0) goto LAB_0010db08;
    iVar7 = local_a8->cell[3]->n;
    if ((long)iVar7 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x65,"main","tri",1,(long)iVar7);
      uVar3 = 1;
    }
    if (iVar7 != 1) goto LAB_0010db08;
    iVar7 = local_a8->cell[0]->n;
    if ((long)iVar7 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x66,"main","edg",1,(long)iVar7);
      uVar3 = 1;
    }
    if (iVar7 != 1) goto LAB_0010db08;
    uVar4 = ref_grid_free(local_a8);
    bVar8 = uVar4 == 0;
    if (!bVar8) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x68,"main",(ulong)uVar4,"free grid");
      uVar3 = uVar4;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
           ,0x5e,"main",(ulong)uVar3,"set up");
LAB_0010db08:
    bVar8 = false;
  }
  if (!bVar8) {
    return uVar3;
  }
  uVar4 = ref_fixture_tet_grid(local_d8,local_c0);
  if (uVar4 == 0) {
    uVar4 = ref_collapse_edge(local_d8[0],0,1);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x74,"main",(ulong)uVar4,"collapse");
      goto LAB_0010ddbe;
    }
    iVar7 = local_d8[0]->cell[8]->n;
    if ((long)iVar7 != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x76,"main","tet",0,(long)iVar7);
      uVar3 = 1;
    }
    uVar4 = uVar3;
    if (iVar7 != 0) goto LAB_0010ddbe;
    iVar7 = local_d8[0]->cell[3]->n;
    if ((long)iVar7 != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x77,"main","tri",0,(long)iVar7);
      uVar3 = 1;
    }
    uVar4 = uVar3;
    if (iVar7 != 0) goto LAB_0010ddbe;
    iVar7 = local_d8[0]->cell[0]->n;
    if ((long)iVar7 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x78,"main","edg",1,(long)iVar7);
      uVar3 = 1;
    }
    uVar4 = uVar3;
    if (iVar7 != 1) goto LAB_0010ddbe;
    uVar4 = ref_cell_nodes(local_d8[0]->cell[0],0,(REF_INT *)&local_a8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x7a,"main",(ulong)uVar4,"nodes");
      goto LAB_0010ddbe;
    }
    iVar7 = (int)local_a8;
    uVar4 = uVar3;
    if ((long)(int)local_a8 != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x7b,"main","1",0,(long)(int)local_a8);
      uVar4 = 1;
    }
    if (iVar7 != 0) goto LAB_0010ddbe;
    iVar7 = local_a8._4_4_;
    if ((long)local_a8._4_4_ != 2) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x7c,"main","2",2,(long)local_a8._4_4_);
      uVar4 = 1;
    }
    if (iVar7 != 2) goto LAB_0010ddbe;
    uVar3 = ref_grid_free(local_d8[0]);
    bVar8 = uVar3 == 0;
    if (!bVar8) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x7e,"main",(ulong)uVar3,"free grid");
      uVar4 = uVar3;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
           ,0x70,"main",(ulong)uVar4,"set up");
LAB_0010ddbe:
    bVar8 = false;
  }
  if (!bVar8) {
    return uVar4;
  }
  uVar3 = ref_fixture_tet_grid((REF_GRID_conflict *)&local_a8,local_c0);
  if (uVar3 == 0) {
    uVar3 = ref_collapse_edge(local_a8,1,2);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x89,"main",(ulong)uVar3,"collapse");
      uVar4 = uVar3;
      goto LAB_0010df4c;
    }
    iVar7 = local_a8->cell[8]->n;
    if ((long)iVar7 != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x8b,"main","tet",0,(long)iVar7);
      uVar4 = 1;
    }
    if (iVar7 != 0) goto LAB_0010df4c;
    iVar7 = local_a8->cell[3]->n;
    if ((long)iVar7 != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x8c,"main","tri",0,(long)iVar7);
      uVar4 = 1;
    }
    if (iVar7 != 0) goto LAB_0010df4c;
    iVar7 = local_a8->cell[0]->n;
    if ((long)iVar7 != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x8d,"main","edg",0,(long)iVar7);
      uVar4 = 1;
    }
    if (iVar7 != 0) goto LAB_0010df4c;
    uVar3 = ref_grid_free(local_a8);
    bVar8 = uVar3 == 0;
    if (!bVar8) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x8f,"main",(ulong)uVar3,"free grid");
      uVar4 = uVar3;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
           ,0x85,"main",(ulong)uVar3,"set up");
    uVar4 = uVar3;
LAB_0010df4c:
    bVar8 = false;
  }
  if (!bVar8) {
    return uVar4;
  }
  uVar3 = ref_fixture_tet_grid((REF_GRID_conflict *)&local_a8,local_c0);
  if (uVar3 == 0) {
    uVar3 = ref_collapse_edge(local_a8,0,3);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x9a,"main",(ulong)uVar3,"collapse");
      uVar4 = uVar3;
      goto LAB_0010e0a3;
    }
    iVar7 = local_a8->node->n;
    if ((long)iVar7 != 3) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x9c,"main","n",3,(long)iVar7);
      uVar4 = 1;
    }
    if (iVar7 != 3) goto LAB_0010e0a3;
    if (local_a8->node->max < 4) {
      bVar8 = false;
    }
    else {
      bVar8 = -1 < local_a8->node->global[3];
    }
    if (bVar8 != false) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x9d,"main","val",0,(ulong)bVar8);
      uVar4 = 1;
      goto LAB_0010e0a3;
    }
    uVar3 = ref_grid_free(local_a8);
    bVar8 = uVar3 == 0;
    if (!bVar8) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x9f,"main",(ulong)uVar3,"free grid");
      uVar4 = uVar3;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
           ,0x96,"main",(ulong)uVar3,"set up");
    uVar4 = uVar3;
LAB_0010e0a3:
    bVar8 = false;
  }
  if (!bVar8) {
    return uVar4;
  }
  uVar3 = ref_fixture_tet_grid(local_d8,local_c0);
  if (uVar3 == 0) {
    uVar3 = ref_collapse_edge(local_d8[0],3,1);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0xab,"main",(ulong)uVar3,"collapse");
      goto LAB_0010e495;
    }
    iVar7 = local_d8[0]->cell[8]->n;
    if ((long)iVar7 != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0xad,"main","tet",0,(long)iVar7);
      uVar4 = 1;
    }
    uVar3 = uVar4;
    if (iVar7 != 0) goto LAB_0010e495;
    iVar7 = local_d8[0]->cell[3]->n;
    if ((long)iVar7 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0xae,"main","tri",1,(long)iVar7);
      uVar4 = 1;
    }
    uVar3 = uVar4;
    if (iVar7 != 1) goto LAB_0010e495;
    iVar7 = local_d8[0]->cell[0]->n;
    if ((long)iVar7 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0xaf,"main","edg",1,(long)iVar7);
      uVar4 = 1;
    }
    uVar3 = uVar4;
    if (iVar7 != 1) goto LAB_0010e495;
    uVar3 = ref_cell_nodes(local_d8[0]->cell[3],0,(REF_INT *)&local_a8);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0xb1,"main",(ulong)uVar3,"nodes");
      goto LAB_0010e495;
    }
    iVar7 = (int)local_a8;
    if ((long)(int)local_a8 != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0xb2,"main","0",0,(long)(int)local_a8);
      uVar4 = 1;
    }
    uVar3 = uVar4;
    if (iVar7 != 0) goto LAB_0010e495;
    iVar7 = local_a8._4_4_;
    if ((long)local_a8._4_4_ != 3) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0xb3,"main","1",3,(long)local_a8._4_4_);
      uVar4 = 1;
    }
    uVar3 = uVar4;
    if (iVar7 != 3) goto LAB_0010e495;
    iVar7 = (int)uStack_a0;
    if ((long)(int)uStack_a0 != 2) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0xb4,"main","2",2,(long)(int)uStack_a0);
      uVar4 = 1;
    }
    uVar3 = uVar4;
    if (iVar7 != 2) goto LAB_0010e495;
    uVar3 = ref_cell_nodes(local_d8[0]->cell[0],0,(REF_INT *)&local_a8);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0xb6,"main",(ulong)uVar3,"nodes");
      goto LAB_0010e495;
    }
    iVar7 = (int)local_a8;
    uVar3 = uVar4;
    if ((long)(int)local_a8 != 3) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0xb7,"main","1",3,(long)(int)local_a8);
      uVar3 = 1;
    }
    if (iVar7 != 3) goto LAB_0010e495;
    iVar7 = local_a8._4_4_;
    if ((long)local_a8._4_4_ != 2) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0xb8,"main","2",2,(long)local_a8._4_4_);
      uVar3 = 1;
    }
    if (iVar7 != 2) goto LAB_0010e495;
    uVar4 = ref_grid_free(local_d8[0]);
    bVar8 = uVar4 == 0;
    if (!bVar8) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0xba,"main",(ulong)uVar4,"free grid");
      uVar3 = uVar4;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
           ,0xa7,"main",(ulong)uVar3,"set up");
LAB_0010e495:
    bVar8 = false;
  }
  if (!bVar8) {
    return uVar3;
  }
  uVar4 = ref_fixture_tet_grid((REF_GRID_conflict *)&local_a8,local_c0);
  if (uVar4 == 0) {
    uVar4 = ref_cell_remove(local_a8->cell[3],0);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0xc3,"main",(ulong)uVar4,"remove tri");
      goto LAB_0010e612;
    }
    uVar4 = ref_collapse_edge_geometry(local_a8,0,1,(REF_BOOL *)local_d8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,200,"main",(ulong)uVar4,"col geom");
      goto LAB_0010e612;
    }
    iVar7 = (int)local_d8[0];
    uVar4 = uVar3;
    if ((long)(int)local_d8[0] != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0xca,"main","interior edge allowed?",1,(long)(int)local_d8[0]);
      uVar4 = 1;
    }
    if (iVar7 != 1) goto LAB_0010e612;
    uVar3 = ref_grid_free(local_a8);
    bVar8 = uVar3 == 0;
    if (!bVar8) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0xcc,"main",(ulong)uVar3,"free grid");
      uVar4 = uVar3;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
           ,0xc2,"main",(ulong)uVar4,"set up");
LAB_0010e612:
    bVar8 = false;
  }
  if (!bVar8) {
    return uVar4;
  }
  uVar3 = ref_fixture_tet_grid(local_d8,local_c0);
  if (uVar3 == 0) {
    local_a8 = (REF_GRID)0x400000001;
    uStack_a0 = 0xa00000002;
    uVar3 = ref_cell_add(local_d8[0]->cell[3],(REF_INT *)&local_a8,(REF_INT *)&local_b8);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x116,"main",(ulong)uVar3,"add tri");
      goto LAB_0010e958;
    }
    local_a8 = (REF_GRID)0x500000001;
    uStack_a0 = 0xa00000004;
    uVar3 = ref_cell_add(local_d8[0]->cell[3],(REF_INT *)&local_a8,&local_ac);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x11b,"main",(ulong)uVar3,"add tri");
      goto LAB_0010e958;
    }
    uVar3 = ref_collapse_edge_geometry(local_d8[0],0,3,&local_b0);
    iVar7 = local_b0;
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x120,"main",(ulong)uVar3,"col geom");
      goto LAB_0010e958;
    }
    if ((long)local_b0 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x121,"main","interior node to face?",1,(long)local_b0);
      uVar4 = 1;
    }
    uVar3 = uVar4;
    if (iVar7 != 1) goto LAB_0010e958;
    uVar3 = ref_collapse_edge_geometry(local_d8[0],0,1,&local_b0);
    iVar7 = local_b0;
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x126,"main",(ulong)uVar3,"col geom");
      goto LAB_0010e958;
    }
    if ((long)local_b0 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x127,"main","parallel and interior to face?",1,(long)local_b0);
      uVar4 = 1;
    }
    uVar3 = uVar4;
    if (iVar7 != 1) goto LAB_0010e958;
    local_d8[0]->cell[3]->c2n[(long)local_ac * (long)local_d8[0]->cell[3]->size_per + 3] = 0x14;
    uVar3 = ref_collapse_edge_geometry(local_d8[0],4,1,&local_b0);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x12e,"main",(ulong)uVar3,"col geom");
      goto LAB_0010e958;
    }
    uVar3 = uVar4;
    if ((long)local_b0 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x12f,"main","parallel along geom edge?",1,(long)local_b0);
      uVar3 = 1;
    }
    if (local_b0 != 1) goto LAB_0010e958;
    uVar4 = ref_grid_free(local_d8[0]);
    bVar8 = uVar4 == 0;
    if (!bVar8) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x131,"main",(ulong)uVar4,"free grid");
      uVar3 = uVar4;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
           ,0x10a,"main",(ulong)uVar3,"set up");
LAB_0010e958:
    bVar8 = false;
  }
  if (!bVar8) {
    return uVar3;
  }
  uVar4 = ref_fixture_tet_grid(local_d8,local_c0);
  if (uVar4 == 0) {
    uVar4 = ref_cell_remove(local_d8[0]->cell[3],0);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x13c,"main",(ulong)uVar4,"remove tri");
      uVar3 = uVar4;
      goto LAB_0010eaea;
    }
    uVar4 = ref_geom_add(local_d8[0]->geom,1,0,0x19,(REF_DBL *)&local_a8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x142,"main",(ulong)uVar4,"add node geom");
      uVar3 = uVar4;
      goto LAB_0010eaea;
    }
    uVar4 = ref_collapse_edge_geometry(local_d8[0],0,1,(REF_BOOL *)&local_b8);
    iVar7 = (int)local_b8;
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x147,"main",(ulong)uVar4,"col geom");
      uVar3 = uVar4;
      goto LAB_0010eaea;
    }
    if ((long)(int)local_b8 != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x149,"main","interior edge allowed?",0,(long)(int)local_b8);
      uVar3 = 1;
    }
    if (iVar7 != 0) goto LAB_0010eaea;
    uVar4 = ref_grid_free(local_d8[0]);
    bVar8 = uVar4 == 0;
    if (!bVar8) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x14b,"main",(ulong)uVar4,"free grid");
      uVar3 = uVar4;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
           ,0x13b,"main",(ulong)uVar4,"set up");
    uVar3 = uVar4;
LAB_0010eaea:
    bVar8 = false;
  }
  if (!bVar8) {
    return uVar3;
  }
  uVar4 = ref_fixture_tet_grid((REF_GRID_conflict *)&local_b8,local_c0);
  if (uVar4 == 0) {
    local_a8 = (REF_GRID)0x400000001;
    uStack_a0 = 0xa00000002;
    uVar4 = ref_cell_add(*(REF_CELL *)(CONCAT44(local_b8._4_4_,(int)local_b8) + 0x28),
                         (REF_INT *)&local_a8,&local_ac);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x163,"main",(ulong)uVar4,"add tri");
      goto LAB_0010ef3c;
    }
    local_a8 = (REF_GRID)0x500000001;
    uStack_a0 = 0xa00000004;
    uVar4 = ref_cell_add(*(REF_CELL *)(CONCAT44(local_b8._4_4_,(int)local_b8) + 0x28),
                         (REF_INT *)&local_a8,&local_b0);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x168,"main",(ulong)uVar4,"add tri");
      goto LAB_0010ef3c;
    }
    local_d8[0] = (REF_GRID)0x3ff0000000000000;
    uVar4 = ref_geom_add(*(REF_GEOM *)(CONCAT44(local_b8._4_4_,(int)local_b8) + 0x98),1,1,0x14,
                         (REF_DBL *)local_d8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x16f,"main",(ulong)uVar4,"add node geom");
      goto LAB_0010ef3c;
    }
    local_d8[0] = (REF_GRID_conflict)&DAT_4000000000000000;
    uVar4 = ref_geom_add(*(REF_GEOM *)(CONCAT44(local_b8._4_4_,(int)local_b8) + 0x98),2,1,0x14,
                         (REF_DBL *)local_d8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x175,"main",(ulong)uVar4,"add node geom");
      goto LAB_0010ef3c;
    }
    uVar4 = ref_collapse_edge_geometry
                      ((REF_GRID)CONCAT44(local_b8._4_4_,(int)local_b8),1,4,&local_c4);
    iVar7 = local_c4;
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x17b,"main",(ulong)uVar4,"col geom");
      goto LAB_0010ef3c;
    }
    if ((long)local_c4 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x17c,"main","pull to edge?",1,(long)local_c4);
      uVar3 = 1;
    }
    uVar4 = uVar3;
    if (iVar7 != 1) goto LAB_0010ef3c;
    uVar4 = ref_collapse_edge_geometry
                      ((REF_GRID)CONCAT44(local_b8._4_4_,(int)local_b8),4,1,&local_c4);
    iVar7 = local_c4;
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x181,"main",(ulong)uVar4,"col geom");
      goto LAB_0010ef3c;
    }
    if ((long)local_c4 != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x182,"main","pull off edge?",0,(long)local_c4);
      uVar3 = 1;
    }
    uVar4 = uVar3;
    if (iVar7 != 0) goto LAB_0010ef3c;
    uVar4 = ref_collapse_edge_geometry
                      ((REF_GRID)CONCAT44(local_b8._4_4_,(int)local_b8),1,2,&local_c4);
    iVar7 = local_c4;
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x187,"main",(ulong)uVar4,"col geom");
      goto LAB_0010ef3c;
    }
    uVar4 = uVar3;
    if ((long)local_c4 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x188,"main","parallel along geom edge?",1,(long)local_c4);
      uVar4 = 1;
    }
    if (iVar7 != 1) goto LAB_0010ef3c;
    uVar3 = ref_grid_free((REF_GRID)CONCAT44(local_b8._4_4_,(int)local_b8));
    bVar8 = uVar3 == 0;
    if (!bVar8) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x18a,"main",(ulong)uVar3,"free grid");
      uVar4 = uVar3;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
           ,0x157,"main",(ulong)uVar4,"set up");
LAB_0010ef3c:
    bVar8 = false;
  }
  if (!bVar8) {
    return uVar4;
  }
  uVar3 = ref_fixture_tet_grid(local_d8,local_c0);
  if (uVar3 == 0) {
    uVar3 = ref_node_add(local_d8[0]->node,4,(REF_INT *)&local_b8);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x19e,"main",(ulong)uVar3,"add node");
      uVar4 = uVar3;
      goto LAB_0010f35f;
    }
    ref_node = local_d8[0]->node;
    pRVar2 = ref_node->real;
    lVar6 = (long)(int)local_b8;
    pRVar2[lVar6 * 0xf] = 1.0;
    pRVar2[lVar6 * 0xf + 1] = 1.0;
    pRVar2[lVar6 * 0xf + 2] = 0.0;
    uVar3 = ref_node_add(ref_node,5,(REF_INT *)&local_b8);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x1a3,"main",(ulong)uVar3,"add node");
      uVar4 = uVar3;
      goto LAB_0010f35f;
    }
    pRVar2 = local_d8[0]->node->real;
    pRVar2[(long)(int)local_b8 * 0xf] = 2.0;
    pRVar2 = pRVar2 + (long)(int)local_b8 * 0xf + 1;
    *pRVar2 = 0.0;
    pRVar2[1] = 0.0;
    local_a8 = (REF_GRID)0x400000001;
    uStack_a0 = 0xa00000002;
    uVar3 = ref_cell_add(local_d8[0]->cell[3],(REF_INT *)&local_a8,&local_ac);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x1ac,"main",(ulong)uVar3,"add tri");
      uVar4 = uVar3;
      goto LAB_0010f35f;
    }
    local_a8 = (REF_GRID)0x500000001;
    uStack_a0 = 0xa00000004;
    uVar3 = ref_cell_add(local_d8[0]->cell[3],(REF_INT *)&local_a8,&local_b0);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x1b1,"main",(ulong)uVar3,"add tri");
      uVar4 = uVar3;
      goto LAB_0010f35f;
    }
    uVar3 = ref_collapse_edge_same_normal(local_d8[0],2,1,&local_c4);
    iVar7 = local_c4;
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x1b6,"main",(ulong)uVar3,"norm");
      uVar4 = uVar3;
      goto LAB_0010f35f;
    }
    if ((long)local_c4 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x1b7,"main","normal will be the same",1,(long)local_c4);
      uVar4 = 1;
    }
    if (iVar7 != 1) goto LAB_0010f35f;
    local_d8[0]->node->real[(long)(int)local_b8 * 0xf + 2] = 0.5;
    uVar3 = ref_collapse_edge_same_normal(local_d8[0],2,1,&local_c4);
    iVar7 = local_c4;
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x1bc,"main",(ulong)uVar3,"norm");
      uVar4 = uVar3;
      goto LAB_0010f35f;
    }
    if ((long)local_c4 != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x1bd,"main","normal would change",0,(long)local_c4);
      uVar4 = 1;
    }
    if (iVar7 != 0) goto LAB_0010f35f;
    pRVar2 = local_d8[0]->node->real;
    lVar6 = (long)(int)local_b8;
    pRVar2[lVar6 * 0xf] = 2.0;
    pRVar2[lVar6 * 0xf + 1] = -1.0;
    pRVar2[lVar6 * 0xf + 2] = 0.0;
    uVar3 = ref_collapse_edge_same_normal(local_d8[0],2,4,&local_c4);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x1c6,"main",(ulong)uVar3,"norm");
      uVar4 = uVar3;
      goto LAB_0010f35f;
    }
    if ((long)local_c4 != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x1c7,"main","tri will have zero area",0,(long)local_c4);
      uVar4 = 1;
    }
    if (local_c4 != 0) goto LAB_0010f35f;
    uVar3 = ref_grid_free(local_d8[0]);
    bVar8 = uVar3 == 0;
    if (!bVar8) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x1c9,"main",(ulong)uVar3,"free grid");
      uVar4 = uVar3;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
           ,0x195,"main",(ulong)uVar3,"set up");
    uVar4 = uVar3;
LAB_0010f35f:
    bVar8 = false;
  }
  if (!bVar8) {
    return uVar4;
  }
  uVar3 = ref_fixture_tet_grid((REF_GRID_conflict *)&local_a8,local_c0);
  if (uVar3 == 0) {
    uVar3 = ref_collapse_edge_mixed(local_a8,0,1,(REF_BOOL *)local_d8);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x1d5,"main",(ulong)uVar3,"col mixed");
      goto LAB_0010f4df;
    }
    iVar7 = (int)local_d8[0];
    uVar3 = uVar4;
    if ((long)(int)local_d8[0] != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x1d7,"main","pure tet allowed?",1,(long)(int)local_d8[0]);
      uVar3 = 1;
    }
    if (iVar7 != 1) goto LAB_0010f4df;
    uVar4 = ref_grid_free(local_a8);
    bVar8 = uVar4 == 0;
    if (!bVar8) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x1d9,"main",(ulong)uVar4,"free grid");
      uVar3 = uVar4;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
           ,0x1d1,"main",(ulong)uVar3,"set up");
LAB_0010f4df:
    bVar8 = false;
  }
  if (!bVar8) {
    return uVar3;
  }
  uVar4 = ref_fixture_pri_tet_cap_grid((REF_GRID_conflict *)&local_a8,local_c0);
  if (uVar4 == 0) {
    uVar4 = ref_collapse_edge_mixed(local_a8,5,6,(REF_BOOL *)local_d8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x1e4,"main",(ulong)uVar4,"col mixed");
      uVar3 = uVar4;
      goto LAB_0010f707;
    }
    iVar7 = (int)local_d8[0];
    if ((long)(int)local_d8[0] != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x1e5,"main","tet near mixed allowed?",1,(long)(int)local_d8[0]);
      uVar3 = 1;
    }
    if (iVar7 != 1) goto LAB_0010f707;
    uVar4 = ref_collapse_edge_mixed(local_a8,6,5,(REF_BOOL *)local_d8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x1e9,"main",(ulong)uVar4,"col mixed");
      uVar3 = uVar4;
      goto LAB_0010f707;
    }
    iVar7 = (int)local_d8[0];
    if ((long)(int)local_d8[0] != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x1ea,"main","tet changing mixed allowed?",0,(long)(int)local_d8[0]);
      uVar3 = 1;
    }
    if (iVar7 != 0) goto LAB_0010f707;
    uVar4 = ref_collapse_edge_mixed(local_a8,3,4,(REF_BOOL *)local_d8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x1ee,"main",(ulong)uVar4,"col mixed");
      uVar3 = uVar4;
      goto LAB_0010f707;
    }
    iVar7 = (int)local_d8[0];
    if ((long)(int)local_d8[0] != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x1ef,"main","mixed collapse allowed?",0,(long)(int)local_d8[0]);
      uVar3 = 1;
    }
    if (iVar7 != 0) goto LAB_0010f707;
    uVar4 = ref_grid_free(local_a8);
    bVar8 = uVar4 == 0;
    if (!bVar8) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x1f1,"main",(ulong)uVar4,"free grid");
      uVar3 = uVar4;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
           ,0x1e0,"main",(ulong)uVar4,"set up");
    uVar3 = uVar4;
LAB_0010f707:
    bVar8 = false;
  }
  if (!bVar8) {
    return uVar3;
  }
  uVar4 = ref_fixture_tet_grid((REF_GRID_conflict *)&local_a8,local_c0);
  if (uVar4 == 0) {
    uVar4 = ref_collapse_edge_local_cell(local_a8,0,1,(REF_BOOL *)local_d8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x1fe,"main",(ulong)uVar4,"col loc");
      uVar3 = uVar4;
      goto LAB_0010f899;
    }
    iVar7 = (int)local_d8[0];
    if ((long)(int)local_d8[0] != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x1ff,"main","local collapse allowed?",1,(long)(int)local_d8[0]);
      uVar3 = 1;
    }
    if (iVar7 != 1) goto LAB_0010f899;
    piVar1 = local_a8->node->part + 2;
    *piVar1 = *piVar1 + 1;
    uVar4 = ref_collapse_edge_local_cell(local_a8,0,1,(REF_BOOL *)local_d8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x207,"main",(ulong)uVar4,"col loc");
      uVar3 = uVar4;
      goto LAB_0010f899;
    }
    iVar7 = (int)local_d8[0];
    if ((long)(int)local_d8[0] != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x208,"main","ghost collapse allowed?",0,(long)(int)local_d8[0]);
      uVar3 = 1;
    }
    if (iVar7 != 0) goto LAB_0010f899;
    uVar4 = ref_grid_free(local_a8);
    bVar8 = uVar4 == 0;
    if (!bVar8) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x20a,"main",(ulong)uVar4,"free grid");
      uVar3 = uVar4;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
           ,0x1f9,"main",(ulong)uVar4,"set up");
    uVar3 = uVar4;
LAB_0010f899:
    bVar8 = false;
  }
  if (!bVar8) {
    return uVar3;
  }
  uVar4 = ref_fixture_tet_grid((REF_GRID_conflict *)&local_a8,local_c0);
  if (uVar4 == 0) {
    uVar4 = ref_collapse_pass(local_a8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x212,"main",(ulong)uVar4,"pass");
      goto LAB_0010fa1a;
    }
    iVar7 = local_a8->node->n;
    uVar4 = uVar3;
    if ((long)iVar7 != 4) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x214,"main","nodes",4,(long)iVar7);
      uVar4 = 1;
    }
    if (iVar7 != 4) goto LAB_0010fa1a;
    iVar7 = local_a8->cell[8]->n;
    if ((long)iVar7 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x215,"main","tets",1,(long)iVar7);
      uVar4 = 1;
    }
    if (iVar7 != 1) goto LAB_0010fa1a;
    uVar3 = ref_grid_free(local_a8);
    bVar8 = uVar3 == 0;
    if (!bVar8) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x217,"main",(ulong)uVar3,"free grid");
      uVar4 = uVar3;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
           ,0x210,"main",(ulong)uVar4,"set up");
LAB_0010fa1a:
    bVar8 = false;
  }
  if (!bVar8) {
    return uVar4;
  }
  uVar3 = ref_fixture_tet_grid((REF_GRID_conflict *)&local_a8,local_c0);
  if (uVar3 == 0) {
    uVar3 = ref_node_metric_form(local_a8->node,3,1.0,0.0,0.0,1.0,0.0,0.01);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x221,"main",(ulong)uVar3,"set top z big");
      uVar4 = uVar3;
      goto LAB_0010fbbd;
    }
    uVar3 = ref_collapse_pass(local_a8);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x223,"main",(ulong)uVar3,"pass");
      uVar4 = uVar3;
      goto LAB_0010fbbd;
    }
    iVar7 = local_a8->node->n;
    if ((long)iVar7 != 3) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x227,"main","nodes",3,(long)iVar7);
      uVar4 = 1;
    }
    if (iVar7 != 3) goto LAB_0010fbbd;
    iVar7 = local_a8->cell[8]->n;
    if ((long)iVar7 != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x228,"main","tets",0,(long)iVar7);
      uVar4 = 1;
    }
    if (iVar7 != 0) goto LAB_0010fbbd;
    uVar3 = ref_grid_free(local_a8);
    bVar8 = uVar3 == 0;
    if (!bVar8) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x22a,"main",(ulong)uVar3,"free grid");
      uVar4 = uVar3;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
           ,0x21d,"main",(ulong)uVar3,"set up");
    uVar4 = uVar3;
LAB_0010fbbd:
    bVar8 = false;
  }
  if (!bVar8) {
    return uVar4;
  }
  uVar3 = ref_fixture_tri2_grid((REF_GRID_conflict *)&local_a8,local_c0);
  if (uVar3 == 0) {
    uVar3 = ref_collapse_edge_same_tangent(local_a8,2,0,(REF_BOOL *)local_d8);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x237,"main",(ulong)uVar3,"same");
      uVar4 = uVar3;
      goto LAB_0010fd5a;
    }
    iVar7 = (int)local_d8[0];
    if ((long)(int)local_d8[0] != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x238,"main","straight tangent collapse allowed?",1,(long)(int)local_d8[0]);
      uVar4 = 1;
    }
    if (iVar7 != 1) goto LAB_0010fd5a;
    local_a8->node->real[1] = 0.5;
    uVar3 = ref_collapse_edge_same_tangent(local_a8,2,0,(REF_BOOL *)local_d8);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x23d,"main",(ulong)uVar3,"same");
      uVar4 = uVar3;
      goto LAB_0010fd5a;
    }
    iVar7 = (int)local_d8[0];
    if ((long)(int)local_d8[0] != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x23e,"main","curved boundary collapse allowed?",0,(long)(int)local_d8[0]);
      uVar4 = 1;
    }
    if (iVar7 != 0) goto LAB_0010fd5a;
    uVar3 = ref_grid_free(local_a8);
    bVar8 = uVar3 == 0;
    if (!bVar8) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x240,"main",(ulong)uVar3,"free grid");
      uVar4 = uVar3;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
           ,0x232,"main",(ulong)uVar3,"set up");
    uVar4 = uVar3;
LAB_0010fd5a:
    bVar8 = false;
  }
  if (!bVar8) {
    return uVar4;
  }
  uVar3 = ref_fixture_tri_grid((REF_GRID_conflict *)&local_a8,local_c0);
  if (uVar3 == 0) {
    uVar3 = ref_collapse_pass(local_a8);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x248,"main",(ulong)uVar3,"pass");
      uVar4 = uVar3;
      goto LAB_0010fe94;
    }
    iVar7 = local_a8->cell[3]->n;
    if ((long)iVar7 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x24a,"main","tri",1,(long)iVar7);
      uVar4 = 1;
    }
    if (iVar7 != 1) goto LAB_0010fe94;
    iVar7 = local_a8->cell[6]->n;
    if ((long)iVar7 != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x24b,"main","qua",0,(long)iVar7);
      uVar4 = 1;
    }
    if (iVar7 != 0) goto LAB_0010fe94;
    uVar3 = ref_grid_free(local_a8);
    bVar8 = uVar3 == 0;
    if (!bVar8) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x24d,"main",(ulong)uVar3,"free grid");
      uVar4 = uVar3;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
           ,0x246,"main",(ulong)uVar3,"set up");
    uVar4 = uVar3;
LAB_0010fe94:
    bVar8 = false;
  }
  if (!bVar8) {
    return uVar4;
  }
  uVar3 = ref_fixture_tri_grid((REF_GRID_conflict *)&local_a8,local_c0);
  if (uVar3 == 0) {
    uVar3 = ref_node_metric_form(local_a8->node,1,1.0,0.0,0.0,0.01,0.0,1.0);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,599,"main",(ulong)uVar3,"set top z big");
      uVar4 = uVar3;
      goto LAB_00110086;
    }
    uVar3 = ref_collapse_pass(local_a8);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x259,"main",(ulong)uVar3,"pass");
      uVar4 = uVar3;
      goto LAB_00110086;
    }
    iVar7 = local_a8->node->n;
    if ((long)iVar7 != 2) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x25b,"main","nodes",2,(long)iVar7);
      uVar4 = 1;
    }
    if (iVar7 != 2) goto LAB_00110086;
    iVar7 = local_a8->cell[3]->n;
    if ((long)iVar7 != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x25c,"main","tri",0,(long)iVar7);
      uVar4 = 1;
    }
    if (iVar7 != 0) goto LAB_00110086;
    iVar7 = local_a8->cell[10]->n;
    if ((long)iVar7 != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x25d,"main","pri",0,(long)iVar7);
      uVar4 = 1;
    }
    if (iVar7 != 0) goto LAB_00110086;
    uVar3 = ref_grid_free(local_a8);
    bVar8 = uVar3 == 0;
    if (!bVar8) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x25f,"main",(ulong)uVar3,"free grid");
      uVar4 = uVar3;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
           ,0x253,"main",(ulong)uVar3,"set up");
    uVar4 = uVar3;
LAB_00110086:
    bVar8 = false;
  }
  if (!bVar8) {
    return uVar4;
  }
  uVar3 = ref_mpi_free(local_c0);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
           ,0x262,"main",(ulong)uVar3,"free");
    return uVar3;
  }
  uVar3 = ref_mpi_stop();
  if (uVar3 == 0) {
    return 0;
  }
  uVar5 = 0x263;
LAB_0010d92d:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c",
         uVar5,"main",(ulong)uVar3,"stop");
  return uVar3;
}

Assistant:

int main(int argc, char *argv[]) {
  REF_MPI ref_mpi;
  RSS(ref_mpi_start(argc, argv), "start");
  RSS(ref_mpi_create(&ref_mpi), "create");

  if (argc > 2) {
    REF_GRID ref_grid;
    REF_INT pass;
    RSS(ref_part_by_extension(&ref_grid, ref_mpi, argv[1]), "examine header");
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "read grid");
    RSS(ref_part_metric(ref_grid_node(ref_grid), argv[2]), "get metric");
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "read metric");
    if (argc > 3) {
      RSS(ref_egads_load(ref_grid_geom(ref_grid), argv[3]), "load egads geom");
      ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "load geom");
    }

    RSS(ref_validation_cell_volume(ref_grid), "vol");
    RSS(ref_histogram_quality(ref_grid), "gram");
    RSS(ref_histogram_ratio(ref_grid), "gram");
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "stats");

    for (pass = 0; pass < 5; pass++) {
      RSS(ref_collapse_pass(ref_grid), "col pass");
      ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt col");

      RSS(ref_validation_cell_volume(ref_grid), "vol");
      RSS(ref_histogram_quality(ref_grid), "gram");
      RSS(ref_histogram_ratio(ref_grid), "gram");
      ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "stats");
    }

    RSS(ref_grid_free(ref_grid), "free");

    RSS(ref_mpi_free(ref_mpi), "free");
    RSS(ref_mpi_stop(), "stop");
    return 0;
  }

  { /* collapse tet into triangle, keep renumbered edge */
    REF_GRID ref_grid;
    REF_INT node0, node1;

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");
    node0 = 0;
    node1 = 3;

    RSS(ref_collapse_edge(ref_grid, node0, node1), "collapse");

    REIS(0, ref_cell_n(ref_grid_tet(ref_grid)), "tet");
    REIS(1, ref_cell_n(ref_grid_tri(ref_grid)), "tri");
    REIS(1, ref_cell_n(ref_grid_edg(ref_grid)), "edg");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* collapse tet into nothing, keep edge */
    REF_GRID ref_grid;
    REF_INT node0, node1;
    REF_INT nodes[REF_CELL_MAX_SIZE_PER];

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");
    node0 = 0;
    node1 = 1;

    RSS(ref_collapse_edge(ref_grid, node0, node1), "collapse");

    REIS(0, ref_cell_n(ref_grid_tet(ref_grid)), "tet");
    REIS(0, ref_cell_n(ref_grid_tri(ref_grid)), "tri");
    REIS(1, ref_cell_n(ref_grid_edg(ref_grid)), "edg");

    RSS(ref_cell_nodes(ref_grid_edg(ref_grid), 0, nodes), "nodes");
    REIS(0, nodes[0], "1");
    REIS(2, nodes[1], "2");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* collapse tet into nothing, no more edge */
    REF_GRID ref_grid;
    REF_INT node0, node1;

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");
    node0 = 1;
    node1 = 2;

    RSS(ref_collapse_edge(ref_grid, node0, node1), "collapse");

    REIS(0, ref_cell_n(ref_grid_tet(ref_grid)), "tet");
    REIS(0, ref_cell_n(ref_grid_tri(ref_grid)), "tri");
    REIS(0, ref_cell_n(ref_grid_edg(ref_grid)), "edg");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* collapse removes node */
    REF_GRID ref_grid;
    REF_INT node0, node1;

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");
    node0 = 0;
    node1 = 3;

    RSS(ref_collapse_edge(ref_grid, node0, node1), "collapse");

    REIS(3, ref_node_n(ref_grid_node(ref_grid)), "n");
    REIS(REF_FALSE, ref_node_valid(ref_grid_node(ref_grid), 3), "val");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* collapse tet, renumber triangle, renumber edge */
    REF_GRID ref_grid;
    REF_INT node0, node1;
    REF_INT nodes[REF_CELL_MAX_SIZE_PER];

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");
    node0 = 3;
    node1 = 1;

    RSS(ref_collapse_edge(ref_grid, node0, node1), "collapse");

    REIS(0, ref_cell_n(ref_grid_tet(ref_grid)), "tet");
    REIS(1, ref_cell_n(ref_grid_tri(ref_grid)), "tri");
    REIS(1, ref_cell_n(ref_grid_edg(ref_grid)), "edg");

    RSS(ref_cell_nodes(ref_grid_tri(ref_grid), 0, nodes), "nodes");
    REIS(0, nodes[0], "0");
    REIS(3, nodes[1], "1");
    REIS(2, nodes[2], "2");

    RSS(ref_cell_nodes(ref_grid_edg(ref_grid), 0, nodes), "nodes");
    REIS(3, nodes[0], "1");
    REIS(2, nodes[1], "2");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* geometry: collapse of volume node? */
    REF_GRID ref_grid;
    REF_INT node0, node1;
    REF_BOOL allowed;

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");
    RSS(ref_cell_remove(ref_grid_tri(ref_grid), 0), "remove tri");

    node0 = 0;
    node1 = 1;
    RSS(ref_collapse_edge_geometry(ref_grid, node0, node1, &allowed),
        "col geom");

    REIS(REF_TRUE, allowed, "interior edge allowed?");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  /*
         /  6252 \
     6253    e    5936
         /  6251 \
     6559    c    5937
      \   \  5938 /  |
        \     |   \ 6252r
          \  6560 /

start 6251 5938
remove cell 12781 nodes 6251 6559 5938  id 1186
remove cell 12154 nodes 5937 6251 5938  id 1186
old cell 12783 nodes 6560 6252 5938  id 1186
new cell 12783 nodes 6560 6252 6251  id 1186
old cell 12787 nodes 6559 6560 5938  id 1186
new cell 12787 nodes 6559 6560 6251  id 1186
old cell 12155 nodes 6252 5937 5938  id 1186
new cell 12155 nodes 6252 5937 6251  id 1186

quad 6251 6252
replaced
 item 0 cell 12155 nodes 6252 5937 6251 id 1186
 item 1 cell 12783 nodes 6560 6252 6251 id 1186
existing
 item 2 cell 12150 nodes 6252 6251 5936 id 1191
 item 3 cell 12780 nodes 6251 6252 6253 id 1192


  {
    REF_GRID ref_grid;
    REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
    REF_INT node0, node1;
    REF_BOOL allowed;

    RSS(ref_grid_create(&ref_grid, ref_mpi), "set up");
    nodes[0] = 6251;
    nodes[1] = 6251;
    nodes[2] = 6251;
    nodes[3] = 6251;

    node0 = 0;
    node1 = 1;
    RSS(ref_collapse_edge_geometry(ref_grid, node0, node1, &allowed),
        "col geom");

    REIS(REF_TRUE, allowed, "interior edge allowed?");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

   */

  { /* geometry: collapse allowed on face? */
    REF_GRID ref_grid;
    REF_INT node0, node1;
    REF_INT nodes[4];
    REF_INT tri1, tri2;
    REF_BOOL allowed;

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");
    /*
    2---4
    |\ 1|\
    |0\ | \
    |  \|2 \
    0---1---5
    */
    nodes[0] = 1;
    nodes[1] = 4;
    nodes[2] = 2;
    nodes[3] = 10;
    RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &tri1), "add tri");
    nodes[0] = 1;
    nodes[1] = 5;
    nodes[2] = 4;
    nodes[3] = 10;
    RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &tri2), "add tri");

    node0 = 0;
    node1 = 3;
    RSS(ref_collapse_edge_geometry(ref_grid, node0, node1, &allowed),
        "col geom");
    REIS(REF_TRUE, allowed, "interior node to face?");

    node0 = 0;
    node1 = 1;
    RSS(ref_collapse_edge_geometry(ref_grid, node0, node1, &allowed),
        "col geom");
    REIS(REF_TRUE, allowed, "parallel and interior to face?");

    ref_cell_c2n(ref_grid_tri(ref_grid), 3, tri2) = 20;

    node0 = 4;
    node1 = 1;
    RSS(ref_collapse_edge_geometry(ref_grid, node0, node1, &allowed),
        "col geom");
    REIS(REF_TRUE, allowed, "parallel along geom edge?");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* geometry: collapse of geom node? */
    REF_GRID ref_grid;
    REF_INT node0, node1;
    REF_BOOL allowed;
    REF_INT node, type, id;
    REF_DBL params[2];

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");
    RSS(ref_cell_remove(ref_grid_tri(ref_grid), 0), "remove tri");

    node = 1;
    type = REF_GEOM_NODE;
    id = 25;
    RSS(ref_geom_add(ref_grid_geom(ref_grid), node, type, id, params),
        "add node geom");

    node0 = 0;
    node1 = 1;
    RSS(ref_collapse_edge_geometry(ref_grid, node0, node1, &allowed),
        "col geom");

    REIS(REF_FALSE, allowed, "interior edge allowed?");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* geometry: collapse allowed on edge with jump? */
    REF_GRID ref_grid;
    REF_INT node0, node1;
    REF_INT nodes[4];
    REF_INT tri1, tri2;
    REF_BOOL allowed;
    REF_INT node, type, id;
    REF_DBL params[2];

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");
    /*
    2---4
    |\ 1|\
    |0\ | \   edge 20, 1-2
    |  \|2 \  face all 10
    0---1---5
    */
    nodes[0] = 1;
    nodes[1] = 4;
    nodes[2] = 2;
    nodes[3] = 10;
    RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &tri1), "add tri");
    nodes[0] = 1;
    nodes[1] = 5;
    nodes[2] = 4;
    nodes[3] = 10;
    RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &tri2), "add tri");

    node = 1;
    type = REF_GEOM_EDGE;
    id = 20;
    params[0] = 1.0;
    RSS(ref_geom_add(ref_grid_geom(ref_grid), node, type, id, params),
        "add node geom");
    node = 2;
    type = REF_GEOM_EDGE;
    id = 20;
    params[0] = 2.0;
    RSS(ref_geom_add(ref_grid_geom(ref_grid), node, type, id, params),
        "add node geom");
    /* add jump? */

    node0 = 1;
    node1 = 4;
    RSS(ref_collapse_edge_geometry(ref_grid, node0, node1, &allowed),
        "col geom");
    REIS(REF_TRUE, allowed, "pull to edge?");

    node0 = 4;
    node1 = 1;
    RSS(ref_collapse_edge_geometry(ref_grid, node0, node1, &allowed),
        "col geom");
    REIS(REF_FALSE, allowed, "pull off edge?");

    node0 = 1;
    node1 = 2;
    RSS(ref_collapse_edge_geometry(ref_grid, node0, node1, &allowed),
        "col geom");
    REIS(REF_TRUE, allowed, "parallel along geom edge?");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* same normal after collapse? */
    REF_GRID ref_grid;
    REF_INT node;
    REF_INT node0, node1;
    REF_INT nodes[4];
    REF_INT tri1, tri2;
    REF_BOOL allowed;

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");
    /*
    2---4      y
    |\ 1|\
    |0\ | \    ^
    |  \|2 \   |
    0---1---5  +-> x
    */

    RSS(ref_node_add(ref_grid_node(ref_grid), 4, &node), "add node");
    ref_node_xyz(ref_grid_node(ref_grid), 0, node) = 1.0;
    ref_node_xyz(ref_grid_node(ref_grid), 1, node) = 1.0;
    ref_node_xyz(ref_grid_node(ref_grid), 2, node) = 0.0;

    RSS(ref_node_add(ref_grid_node(ref_grid), 5, &node), "add node");
    ref_node_xyz(ref_grid_node(ref_grid), 0, node) = 2.0;
    ref_node_xyz(ref_grid_node(ref_grid), 1, node) = 0.0;
    ref_node_xyz(ref_grid_node(ref_grid), 2, node) = 0.0;

    nodes[0] = 1;
    nodes[1] = 4;
    nodes[2] = 2;
    nodes[3] = 10;
    RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &tri1), "add tri");
    nodes[0] = 1;
    nodes[1] = 5;
    nodes[2] = 4;
    nodes[3] = 10;
    RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &tri2), "add tri");

    node0 = 2;
    node1 = 1;
    RSS(ref_collapse_edge_same_normal(ref_grid, node0, node1, &allowed),
        "norm");
    REIS(REF_TRUE, allowed, "normal will be the same");

    ref_node_xyz(ref_grid_node(ref_grid), 2, node) = 0.5;

    RSS(ref_collapse_edge_same_normal(ref_grid, node0, node1, &allowed),
        "norm");
    REIS(REF_FALSE, allowed, "normal would change");

    ref_node_xyz(ref_grid_node(ref_grid), 0, node) = 2.0;
    ref_node_xyz(ref_grid_node(ref_grid), 1, node) = -1.0;
    ref_node_xyz(ref_grid_node(ref_grid), 2, node) = 0.0;

    node0 = 2;
    node1 = 4;
    RSS(ref_collapse_edge_same_normal(ref_grid, node0, node1, &allowed),
        "norm");
    REIS(REF_FALSE, allowed, "tri will have zero area");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* mixed: collapse tet allowed? */
    REF_GRID ref_grid;
    REF_INT node0, node1;
    REF_BOOL allowed;

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");

    node0 = 0;
    node1 = 1;
    RSS(ref_collapse_edge_mixed(ref_grid, node0, node1, &allowed), "col mixed");

    REIS(REF_TRUE, allowed, "pure tet allowed?");

    RSS(ref_grid_free(ref_grid), "free grid");
  }
  { /* mixed: collapse of/near mixed allowed? */
    REF_GRID ref_grid;
    REF_INT node0, node1;
    REF_BOOL allowed;

    RSS(ref_fixture_pri_tet_cap_grid(&ref_grid, ref_mpi), "set up");

    node0 = 5;
    node1 = 6;
    RSS(ref_collapse_edge_mixed(ref_grid, node0, node1, &allowed), "col mixed");
    REIS(REF_TRUE, allowed, "tet near mixed allowed?");

    node0 = 6;
    node1 = 5;
    RSS(ref_collapse_edge_mixed(ref_grid, node0, node1, &allowed), "col mixed");
    REIS(REF_FALSE, allowed, "tet changing mixed allowed?");

    node0 = 3;
    node1 = 4;
    RSS(ref_collapse_edge_mixed(ref_grid, node0, node1, &allowed), "col mixed");
    REIS(REF_FALSE, allowed, "mixed collapse allowed?");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* local: collapse allowed? */
    REF_GRID ref_grid;
    REF_INT node0, node1;
    REF_BOOL allowed;

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");

    node0 = 0;
    node1 = 1;
    RSS(ref_collapse_edge_local_cell(ref_grid, node0, node1, &allowed),
        "col loc");
    REIS(REF_TRUE, allowed, "local collapse allowed?");

    ref_node_part(ref_grid_node(ref_grid), 2) =
        ref_node_part(ref_grid_node(ref_grid), 2) + 1;

    node0 = 0;
    node1 = 1;
    RSS(ref_collapse_edge_local_cell(ref_grid, node0, node1, &allowed),
        "col loc");
    REIS(REF_FALSE, allowed, "ghost collapse allowed?");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* no collapse, close enough */
    REF_GRID ref_grid;

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");

    RSS(ref_collapse_pass(ref_grid), "pass");

    REIS(4, ref_node_n(ref_grid_node(ref_grid)), "nodes");
    REIS(1, ref_cell_n(ref_grid_tet(ref_grid)), "tets");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* top big */
    REF_GRID ref_grid;

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");

    RSS(ref_node_metric_form(ref_grid_node(ref_grid), 3, 1, 0, 0, 1, 0,
                             1.0 / (10.0 * 10.0)),
        "set top z big");

    RSS(ref_collapse_pass(ref_grid), "pass");

    /* ref_export_by_extension(ref_grid,"ref_collapse_test.tec"); */

    REIS(3, ref_node_n(ref_grid_node(ref_grid)), "nodes");
    REIS(0, ref_cell_n(ref_grid_tet(ref_grid)), "tets");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* edge tangent: collapse allowed? */
    REF_GRID ref_grid;
    REF_INT keep, remove;
    REF_BOOL allowed;

    RSS(ref_fixture_tri2_grid(&ref_grid, ref_mpi), "set up");

    keep = 2;
    remove = 0;
    RSS(ref_collapse_edge_same_tangent(ref_grid, keep, remove, &allowed),
        "same");
    REIS(REF_TRUE, allowed, "straight tangent collapse allowed?");

    ref_node_xyz(ref_grid_node(ref_grid), 1, remove) = 0.5;

    RSS(ref_collapse_edge_same_tangent(ref_grid, keep, remove, &allowed),
        "same");
    REIS(REF_FALSE, allowed, "curved boundary collapse allowed?");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* no collapse, close enough, twod */
    REF_GRID ref_grid;

    RSS(ref_fixture_tri_grid(&ref_grid, ref_mpi), "set up");

    RSS(ref_collapse_pass(ref_grid), "pass");

    REIS(1, ref_cell_n(ref_grid_tri(ref_grid)), "tri");
    REIS(0, ref_cell_n(ref_grid_qua(ref_grid)), "qua");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* top big, twod */
    REF_GRID ref_grid;

    RSS(ref_fixture_tri_grid(&ref_grid, ref_mpi), "set up");

    RSS(ref_node_metric_form(ref_grid_node(ref_grid), 1, 1, 0, 0,
                             1.0 / (10.0 * 10.0), 0, 1),
        "set top z big");

    RSS(ref_collapse_pass(ref_grid), "pass");

    REIS(2, ref_node_n(ref_grid_node(ref_grid)), "nodes");
    REIS(0, ref_cell_n(ref_grid_tri(ref_grid)), "tri");
    REIS(0, ref_cell_n(ref_grid_pri(ref_grid)), "pri");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  RSS(ref_mpi_free(ref_mpi), "free");
  RSS(ref_mpi_stop(), "stop");
  return 0;
}